

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O1

QString * __thiscall QProcEnvValue::string(QString *__return_storage_ptr__,QProcEnvValue *this)

{
  Data *pDVar1;
  QString *this_00;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->stringValue).d.size == 0) &&
     (this_00 = (QString *)(this->byteValue).d.size, this_00 != (QString *)0x0)) {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)(this->byteValue).d.ptr;
    QString::fromLocal8Bit(&local_38,this_00,ba);
    data = &((this->stringValue).d.d)->super_QArrayData;
    pcVar2 = (this->stringValue).d.ptr;
    (this->stringValue).d.d = local_38.d.d;
    (this->stringValue).d.ptr = local_38.d.ptr;
    qVar3 = (this->stringValue).d.size;
    (this->stringValue).d.size = local_38.d.size;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar2;
    local_38.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  pDVar1 = (this->stringValue).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (this->stringValue).d.ptr;
  (__return_storage_ptr__->d).size = (this->stringValue).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString string() const
    {
        if (stringValue.isEmpty() && !byteValue.isEmpty())
            stringValue = QString::fromLocal8Bit(byteValue);
        return stringValue;
    }